

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void copy_stemmer(char *zIn,int nIn,char *zOut,int *pnOut)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar8 = 0;
  uVar5 = 0;
  if (0 < nIn) {
    uVar5 = (ulong)(uint)nIn;
  }
  bVar3 = false;
  for (; uVar5 != uVar8; uVar8 = uVar8 + 1) {
    bVar1 = zIn[uVar8];
    bVar4 = bVar3;
    if ((byte)(bVar1 - 0x30) < 10) {
      bVar4 = true;
    }
    bVar2 = bVar1 | 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      bVar2 = bVar1;
      bVar3 = bVar4;
    }
    zOut[uVar8] = bVar2;
  }
  uVar7 = 3;
  if (!bVar3) {
    uVar7 = 10;
  }
  if ((int)(uVar7 * 2) < nIn) {
    uVar5 = (ulong)uVar7;
    for (lVar6 = (long)(int)(nIn - uVar7); lVar6 < (long)(ulong)(uint)nIn; lVar6 = lVar6 + 1) {
      zOut[uVar5] = zOut[lVar6];
      uVar5 = uVar5 + 1;
    }
  }
  zOut[(int)uVar5] = '\0';
  *pnOut = (int)uVar5;
  return;
}

Assistant:

static void copy_stemmer(const char *zIn, int nIn, char *zOut, int *pnOut){
  int i, mx, j;
  int hasDigit = 0;
  for(i=0; i<nIn; i++){
    char c = zIn[i];
    if( c>='A' && c<='Z' ){
      zOut[i] = c - 'A' + 'a';
    }else{
      if( c>='0' && c<='9' ) hasDigit = 1;
      zOut[i] = c;
    }
  }
  mx = hasDigit ? 3 : 10;
  if( nIn>mx*2 ){
    for(j=mx, i=nIn-mx; i<nIn; i++, j++){
      zOut[j] = zOut[i];
    }
    i = j;
  }
  zOut[i] = 0;
  *pnOut = i;
}